

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall embree::Camera::dolly(Camera *this,float ds)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float k;
  float dollySpeed;
  __m128 c_2;
  __m128 r;
  __m128 a_2;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  float local_9ec;
  undefined4 local_9e8;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  undefined8 *local_730;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c8;
  float local_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  
  local_9e8 = 0x3c23d70a;
  local_9ec = powf(0.99,in_XMM0_Da);
  puVar6 = in_RDI + 2;
  local_9b0 = &local_a18;
  uVar1 = *puVar6;
  uVar2 = in_RDI[3];
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  local_578._0_4_ = (float)uVar1;
  local_578._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_570._0_4_ = (float)uVar2;
  uStack_570._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_588._0_4_ = (float)uVar3;
  local_588._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_580._0_4_ = (float)uVar4;
  uStack_580._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_748 = (float)local_578 - (float)local_588;
  fStack_744 = local_578._4_4_ - local_588._4_4_;
  fStack_740 = (float)uStack_570 - (float)uStack_580;
  fStack_73c = uStack_570._4_4_ - uStack_580._4_4_;
  local_4f8 = CONCAT44(fStack_744,local_748);
  uStack_4f0 = CONCAT44(fStack_73c,fStack_740);
  local_500 = &local_538;
  local_4d8 = local_748 * local_748;
  fStack_4d4 = fStack_744 * fStack_744;
  fStack_4d0 = fStack_740 * fStack_740;
  fStack_4cc = fStack_73c * fStack_73c;
  local_428 = CONCAT44(fStack_4d4,local_4d8);
  uStack_420 = CONCAT44(fStack_4cc,fStack_4d0);
  local_418 = &local_458;
  local_358 = &local_468;
  local_198 = CONCAT44(fStack_4d4,fStack_4d4);
  uStack_190 = CONCAT44(fStack_4d4,fStack_4d4);
  local_338 = &local_478;
  local_208 = CONCAT44(fStack_4d0,fStack_4d0);
  uStack_200 = CONCAT44(fStack_4d0,fStack_4d0);
  local_248 = &local_498;
  local_1c8 = local_4d8 + fStack_4d4;
  fStack_1c4 = fStack_4d4 + fStack_4d4;
  fStack_1c0 = fStack_4d0 + fStack_4d4;
  fStack_1bc = fStack_4cc + fStack_4d4;
  local_1f8 = CONCAT44(fStack_1c4,local_1c8);
  uStack_1f0 = CONCAT44(fStack_1bc,fStack_1c0);
  local_410 = &local_488;
  local_4bc = local_1c8 + fStack_4d0;
  fStack_234 = fStack_1c4 + fStack_4d0;
  fStack_230 = fStack_1c0 + fStack_4d0;
  fStack_22c = fStack_1bc + fStack_4d0;
  local_438 = CONCAT44(fStack_234,local_4bc);
  uStack_430 = CONCAT44(fStack_22c,fStack_230);
  local_9b8 = puVar6;
  local_730 = local_9b0;
  local_588 = uVar3;
  uStack_580 = uVar4;
  local_578 = uVar1;
  uStack_570 = uVar2;
  local_540 = local_9b0;
  local_520 = local_9b0;
  local_518 = local_9b0;
  local_510 = local_9b0;
  local_508 = local_9b0;
  local_4e8 = local_4f8;
  uStack_4e0 = uStack_4f0;
  local_4c8 = local_500;
  local_440 = local_500;
  local_360 = local_418;
  local_340 = local_418;
  local_250 = local_338;
  local_240 = local_410;
  local_238 = local_4bc;
  local_220 = local_410;
  local_218 = local_338;
  local_210 = local_248;
  local_1e0 = local_358;
  local_1d8 = local_418;
  local_1d0 = local_248;
  local_1b0 = local_248;
  local_1a8 = local_358;
  local_1a0 = local_418;
  local_188 = local_428;
  uStack_180 = uStack_420;
  local_178 = local_418;
  local_170 = local_358;
  local_168 = local_198;
  uStack_160 = uStack_190;
  local_150 = local_358;
  local_148 = fStack_4d4;
  fStack_144 = fStack_4d4;
  fStack_140 = fStack_4d4;
  fStack_13c = fStack_4d4;
  local_138 = local_428;
  uStack_130 = uStack_420;
  local_120 = local_418;
  local_b8 = local_418;
  local_b0 = local_338;
  local_a8 = local_208;
  uStack_a0 = uStack_200;
  local_90 = local_338;
  local_88 = fStack_4d0;
  fStack_84 = fStack_4d0;
  fStack_80 = fStack_4d0;
  fStack_7c = fStack_4d0;
  local_78 = local_428;
  uStack_70 = uStack_420;
  local_60 = local_418;
  local_a18 = local_4f8;
  uStack_a10 = uStack_4f0;
  local_538 = local_428;
  uStack_530 = uStack_420;
  local_498 = local_1f8;
  uStack_490 = uStack_1f0;
  local_488 = local_438;
  uStack_480 = uStack_430;
  local_478 = local_208;
  uStack_470 = uStack_200;
  local_468 = local_198;
  uStack_460 = uStack_190;
  local_458 = local_428;
  uStack_450 = uStack_420;
  fVar7 = sqrtf(local_4bc);
  fVar7 = fVar7 * (1.0 - local_9ec);
  local_558 = (float)*puVar6;
  fStack_554 = (float)((ulong)*puVar6 >> 0x20);
  fStack_550 = (float)in_RDI[3];
  local_568 = (float)*in_RDI;
  fStack_564 = (float)((ulong)*in_RDI >> 0x20);
  fStack_560 = (float)in_RDI[1];
  auVar5 = ZEXT416((uint)((local_558 - local_568) * (local_558 - local_568) +
                          (fStack_554 - fStack_564) * (fStack_554 - fStack_564) +
                         (fStack_550 - fStack_560) * (fStack_550 - fStack_560)));
  rsqrtss(auVar5,auVar5);
  local_828 = (float)local_a28;
  fStack_824 = (float)((ulong)local_a28 >> 0x20);
  fStack_820 = (float)uStack_a20;
  fStack_81c = (float)((ulong)uStack_a20 >> 0x20);
  local_4a8 = (float)*in_RDI;
  fStack_4a4 = (float)((ulong)*in_RDI >> 0x20);
  fStack_4a0 = (float)in_RDI[1];
  fStack_49c = (float)((ulong)in_RDI[1] >> 0x20);
  *in_RDI = CONCAT44(fStack_4a4 + fVar7 * fStack_824,local_4a8 + fVar7 * local_828);
  in_RDI[1] = CONCAT44(fStack_49c + fVar7 * fStack_81c,fStack_4a0 + fVar7 * fStack_820);
  return;
}

Assistant:

void dolly (float ds)
    {
      float dollySpeed = 0.01f;
      float k = powf((1.0f-dollySpeed), ds);
      from += length(to-from) * (1-k) * normalize(to-from);
    }